

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O2

bool __thiscall
iutest::floating_point<long_double>::NanSensitiveAlmostNear
          (floating_point<long_double> *this,_Myt *rhs,longdouble max_abs_error)

{
  bool bVar1;
  
  if ((((undefined1  [16])this->m_v & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0
       || (~*(uint *)((long)&this->m_v + 8) & 0x7fff) != 0) ||
     ((~*(uint *)((long)&rhs->m_v + 8) & 0x7fff) != 0 ||
      ((undefined1  [16])rhs->m_v & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0))
  {
    bVar1 = AlmostNear(this,rhs,max_abs_error);
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool    NanSensitiveAlmostNear(const _Myt& rhs, RawType max_abs_error) const
    {
        if( is_nan() && rhs.is_nan() )
        {
            return true;
        }
        return AlmostNear(rhs, max_abs_error);
    }